

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libSupport.c
# Opt level: O0

void call_inits(Abc_Frame_t *pAbc)

{
  code *pcVar1;
  lib_init_end_func init_func;
  int i;
  Abc_Frame_t *pAbc_local;
  
  for (init_func._4_4_ = 0; libHandles[(int)init_func._4_4_] != (void *)0x0;
      init_func._4_4_ = init_func._4_4_ + 1) {
    pcVar1 = (code *)get_fnct_ptr(init_func._4_4_,"abc_init");
    if (pcVar1 == (code *)0x0) {
      printf("Warning: Failed to initialize library %d.\n",(ulong)init_func._4_4_);
    }
    else {
      (*pcVar1)(pAbc);
    }
  }
  return;
}

Assistant:

void call_inits(Abc_Frame_t* pAbc) {
    int i;
    lib_init_end_func init_func;
    for (i = 0; libHandles[i] != 0; i++) {
        init_func = (lib_init_end_func) get_fnct_ptr(i, "abc_init");
        if (init_func == 0) {
            printf("Warning: Failed to initialize library %d.\n", i);
        } else {
            (*init_func)(pAbc);
        }
    }
}